

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZGeoElSide,_10>::Resize
          (TPZManVector<TPZGeoElSide,_10> *this,int64_t newsize,TPZGeoElSide *object)

{
  TPZGeoElSide *pTVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  TPZGeoEl **ppTVar7;
  long lVar8;
  long lVar9;
  TPZGeoElSide *pTVar10;
  ulong uVar11;
  double dVar12;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar6 = (this->super_TPZVec<TPZGeoElSide>).fNElements;
  if (newsize != lVar6) {
    lVar9 = (this->super_TPZVec<TPZGeoElSide>).fNAlloc;
    if (lVar9 < newsize) {
      if ((ulong)newsize < 0xb) {
        if (lVar6 < 1) {
          lVar6 = 0;
        }
        else {
          pTVar1 = (this->super_TPZVec<TPZGeoElSide>).fStore;
          lVar8 = 0;
          lVar9 = lVar6;
          do {
            *(undefined4 *)((long)&this->fExtAlloc[0].fSide + lVar8) =
                 *(undefined4 *)((long)&pTVar1->fSide + lVar8);
            *(undefined8 *)((long)&this->fExtAlloc[0].fGeoEl + lVar8) =
                 *(undefined8 *)((long)&pTVar1->fGeoEl + lVar8);
            lVar8 = lVar8 + 0x18;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        lVar9 = newsize - lVar6;
        if (lVar9 != 0 && lVar6 <= newsize) {
          ppTVar7 = &this->fExtAlloc[lVar6].fGeoEl;
          do {
            *(int *)(ppTVar7 + 1) = object->fSide;
            *ppTVar7 = object->fGeoEl;
            ppTVar7 = ppTVar7 + 3;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        pTVar1 = (this->super_TPZVec<TPZGeoElSide>).fStore;
        if (pTVar1 != (TPZGeoElSide *)0x0 && pTVar1 != this->fExtAlloc) {
          operator_delete__(&pTVar1[-1].fSide,*(long *)&pTVar1[-1].fSide * 0x18 + 8);
        }
        (this->super_TPZVec<TPZGeoElSide>).fStore = this->fExtAlloc;
        (this->super_TPZVec<TPZGeoElSide>).fNElements = newsize;
        (this->super_TPZVec<TPZGeoElSide>).fNAlloc = 10;
      }
      else {
        dVar12 = (double)lVar9 * 1.2;
        uVar11 = (long)dVar12;
        if (dVar12 < (double)newsize) {
          uVar11 = newsize;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar11;
        uVar3 = SUB168(auVar2 * ZEXT816(0x18),0);
        uVar4 = uVar3 + 8;
        if (0xfffffffffffffff7 < uVar3) {
          uVar4 = 0xffffffffffffffff;
        }
        uVar3 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
          uVar3 = uVar4;
        }
        puVar5 = (ulong *)operator_new__(uVar3);
        *puVar5 = uVar11;
        pTVar1 = (TPZGeoElSide *)(puVar5 + 1);
        if (uVar11 != 0) {
          pTVar10 = pTVar1;
          do {
            (pTVar10->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760
            ;
            pTVar10->fGeoEl = (TPZGeoEl *)0x0;
            pTVar10->fSide = -1;
            pTVar10 = pTVar10 + 1;
          } while (pTVar10 != pTVar1 + uVar11);
        }
        if (lVar6 < 1) {
          lVar6 = 0;
        }
        else {
          pTVar10 = (this->super_TPZVec<TPZGeoElSide>).fStore;
          lVar8 = 0;
          lVar9 = lVar6;
          do {
            *(undefined4 *)((long)puVar5 + lVar8 + 0x18) =
                 *(undefined4 *)((long)&pTVar10->fSide + lVar8);
            *(undefined8 *)((long)puVar5 + lVar8 + 0x10) =
                 *(undefined8 *)((long)&pTVar10->fGeoEl + lVar8);
            lVar8 = lVar8 + 0x18;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        lVar9 = newsize - lVar6;
        if (lVar9 != 0 && lVar6 <= newsize) {
          puVar5 = puVar5 + lVar6 * 3 + 2;
          do {
            *(int *)(puVar5 + 1) = object->fSide;
            *puVar5 = (ulong)object->fGeoEl;
            puVar5 = puVar5 + 3;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        pTVar10 = (this->super_TPZVec<TPZGeoElSide>).fStore;
        if (pTVar10 != (TPZGeoElSide *)0x0 && pTVar10 != this->fExtAlloc) {
          operator_delete__(&pTVar10[-1].fSide,*(long *)&pTVar10[-1].fSide * 0x18 + 8);
        }
        (this->super_TPZVec<TPZGeoElSide>).fStore = pTVar1;
        (this->super_TPZVec<TPZGeoElSide>).fNElements = newsize;
        (this->super_TPZVec<TPZGeoElSide>).fNAlloc = uVar11;
      }
    }
    else {
      lVar9 = newsize - lVar6;
      if (lVar9 != 0 && lVar6 <= newsize) {
        lVar6 = lVar6 * 0x18 + 8;
        do {
          pTVar1 = (this->super_TPZVec<TPZGeoElSide>).fStore;
          *(int *)((long)&pTVar1->fGeoEl + lVar6) = object->fSide;
          *(TPZGeoEl **)((long)&(pTVar1->super_TPZSavable)._vptr_TPZSavable + lVar6) =
               object->fGeoEl;
          lVar6 = lVar6 + 0x18;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      (this->super_TPZVec<TPZGeoElSide>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}